

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O0

void __thiscall QMakeEvaluator::setTemplate(QMakeEvaluator *this)

{
  bool bVar1;
  ProString *str;
  iterator iVar2;
  ProString *in_RDI;
  long in_FS_OFFSET;
  ProStringList *values;
  ProString val;
  ProString *in_stack_fffffffffffffe98;
  ProString *in_stack_fffffffffffffea0;
  ProString *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb8;
  ProKey *in_stack_fffffffffffffec0;
  QMakeEvaluator *in_stack_fffffffffffffec8;
  const_iterator in_stack_fffffffffffffef0;
  const_iterator in_stack_fffffffffffffef8;
  undefined1 local_c8 [48];
  const_iterator local_98;
  ProString *local_90;
  const_iterator local_88 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str = (ProString *)valuesRef(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bVar1 = QString::isEmpty((QString *)0x2f730d);
  if (bVar1) {
    bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x2f7381);
    if (bVar1) {
      ProString::ProString(in_stack_fffffffffffffea0,in_stack_fffffffffffffeb8);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      ProString::~ProString((ProString *)0x2f73c4);
    }
    else {
      local_90 = (ProString *)QList<ProString>::begin((QList<ProString> *)str);
      iVar2 = QList<ProString>::iterator::operator+(str,in_stack_fffffffffffffe98);
      QList<ProString>::const_iterator::const_iterator(local_88,iVar2);
      iVar2 = QList<ProString>::end(str);
      QList<ProString>::const_iterator::const_iterator(&local_98,iVar2);
      QList<ProString>::erase
                ((QList<ProString> *)iVar2.i,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      in_stack_fffffffffffffea0 = str;
      str = in_stack_fffffffffffffea8;
    }
  }
  else {
    ProString::ProString(in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->m_string);
    ProStringList::ProStringList
              ((ProStringList *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    ProStringList::operator=
              ((ProStringList *)in_stack_fffffffffffffea0,(ProStringList *)in_stack_fffffffffffffe98
              );
    ProStringList::~ProStringList((ProStringList *)0x2f7365);
    ProString::~ProString((ProString *)0x2f7372);
    str = in_stack_fffffffffffffea8;
  }
  bVar1 = QString::isEmpty((QString *)0x2f7468);
  if (!bVar1) {
    memset(local_c8,0xaa,0x30);
    QList<ProString>::first((QList<ProString> *)in_stack_fffffffffffffea0);
    ProString::ProString(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    bVar1 = ProString::startsWith
                      (in_RDI,&str->m_string,
                       (CaseSensitivity)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    if (!bVar1) {
      ::operator+(&in_stack_fffffffffffffea0->m_string,in_stack_fffffffffffffe98);
      ProString::ProString<QString&,ProString&>
                (in_RDI,(QStringBuilder<QString_&,_ProString_&> *)str);
      ProStringList::ProStringList
                ((ProStringList *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      ProStringList::operator=
                ((ProStringList *)in_stack_fffffffffffffea0,
                 (ProStringList *)in_stack_fffffffffffffe98);
      ProStringList::~ProStringList((ProStringList *)0x2f7534);
      ProString::~ProString((ProString *)0x2f753e);
    }
    ProString::~ProString((ProString *)0x2f754b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeEvaluator::setTemplate()
{
    ProStringList &values = valuesRef(statics.strTEMPLATE);
    if (!m_option->user_template.isEmpty()) {
        // Don't allow override
        values = ProStringList(ProString(m_option->user_template));
    } else {
        if (values.isEmpty())
            values.append(ProString("app"));
        else
            values.erase(values.begin() + 1, values.end());
    }
    if (!m_option->user_template_prefix.isEmpty()) {
        ProString val = values.first();
        if (!val.startsWith(m_option->user_template_prefix))
            values = ProStringList(ProString(m_option->user_template_prefix + val));
    }
}